

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall
leveldb::DBTest_RecoverDuringMemtableCompaction_Test::~DBTest_RecoverDuringMemtableCompaction_Test
          (DBTest_RecoverDuringMemtableCompaction_Test *this)

{
  DBTest::~DBTest(&this->super_DBTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, RecoverDuringMemtableCompaction) {
  do {
    Options options = CurrentOptions();
    options.env = env_;
    options.write_buffer_size = 1000000;
    Reopen(&options);

    // Trigger a long memtable compaction and reopen the database during it
    ASSERT_LEVELDB_OK(Put("foo", "v1"));  // Goes to 1st log file
    ASSERT_LEVELDB_OK(
        Put("big1", std::string(10000000, 'x')));  // Fills memtable
    ASSERT_LEVELDB_OK(
        Put("big2", std::string(1000, 'y')));  // Triggers compaction
    ASSERT_LEVELDB_OK(Put("bar", "v2"));       // Goes to new log file

    Reopen(&options);
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_EQ("v2", Get("bar"));
    ASSERT_EQ(std::string(10000000, 'x'), Get("big1"));
    ASSERT_EQ(std::string(1000, 'y'), Get("big2"));
  } while (ChangeOptions());
}